

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmComputeLinkInformation * __thiscall
cmGeneratorTarget::GetLinkInformation(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  iterator iVar3;
  cmComputeLinkInformation *pcVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>,_bool>
  pVar5;
  string key;
  value_type entry;
  string local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>
  local_58;
  
  cmsys::SystemTools::UpperCase(&local_78,config);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>_>
          ::find(&(this->LinkInformation)._M_t,&local_78);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->LinkInformation)._M_t._M_impl.super__Rb_tree_header) {
    pcVar4 = (cmComputeLinkInformation *)operator_new(0x778);
    cmComputeLinkInformation::cmComputeLinkInformation(pcVar4,this,config);
    bVar2 = cmComputeLinkInformation::Compute(pcVar4);
    if (!bVar2) {
      cmComputeLinkInformation::~cmComputeLinkInformation(pcVar4);
      operator_delete(pcVar4,0x778);
      pcVar4 = (cmComputeLinkInformation *)0x0;
    }
    paVar1 = &local_58.first.field_2;
    local_58.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    local_58.second = pcVar4;
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>>
                        *)&this->LinkInformation,&local_58);
    iVar3._M_node = (_Base_ptr)pVar5.first._M_node;
    if (pcVar4 != (cmComputeLinkInformation *)0x0) {
      CheckPropertyCompatibility(this,pcVar4,config);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.first._M_dataplus._M_p,
                      local_58.first.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar4 = *(cmComputeLinkInformation **)(iVar3._M_node + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return pcVar4;
}

Assistant:

cmComputeLinkInformation*
cmGeneratorTarget::GetLinkInformation(const std::string& config) const
{
  // Lookup any existing information for this configuration.
  std::string key(cmSystemTools::UpperCase(config));
  cmTargetLinkInformationMap::iterator
    i = this->LinkInformation.find(key);
  if(i == this->LinkInformation.end())
    {
    // Compute information for this configuration.
    cmComputeLinkInformation* info =
      new cmComputeLinkInformation(this, config);
    if(!info || !info->Compute())
      {
      delete info;
      info = 0;
      }

    // Store the information for this configuration.
    cmTargetLinkInformationMap::value_type entry(key, info);
    i = this->LinkInformation.insert(entry).first;

    if (info)
      {
      this->CheckPropertyCompatibility(info, config);
      }
    }
  return i->second;
}